

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeaderBase.cpp
# Opt level: O0

int __thiscall HttpHeaderBase::addFieldMap(HttpHeaderBase *this,FieldMap *fieldMap)

{
  FieldMap *local_20;
  FieldMap *fieldMap_local;
  HttpHeaderBase *this_local;
  
  if (fieldMap == (FieldMap *)0x0) {
    this_local._4_4_ = -1;
  }
  else {
    local_20 = fieldMap;
    fieldMap_local = (FieldMap *)this;
    JetHead::list<FieldMap_*>::push_back(&this->mFieldMappings,&local_20);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int HttpHeaderBase::addFieldMap(FieldMap *fieldMap)
{
	TRACE_BEGIN(LOG_LVL_INFO);
	
	if (fieldMap == NULL)
		return -1;
	
	// Currently the assumption is that people adding field maps are doing
	// it in order.  ie.   HTTP->DLNA->DTV and that they want the mappings
	// searched in that order.  So mappings are appended to the tail as they
	// are added.
	mFieldMappings.push_back(fieldMap);
	return 0;
}